

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O2

int Abc_AttachCompare(uint **puTruthGates,int nGates,uint *uTruthNode)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)nGates;
  if (nGates < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return -1;
    }
    if ((*puTruthGates[uVar1] == *uTruthNode) && (puTruthGates[uVar1][1] == uTruthNode[1])) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

int Abc_AttachCompare( unsigned ** puTruthGates, int nGates, unsigned * uTruthNode )
{
    int i;
    for ( i = 0; i < nGates; i++ )
        if ( puTruthGates[i][0] == uTruthNode[0] && puTruthGates[i][1] == uTruthNode[1] )
            return i;
    return -1;
}